

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O1

string_view __thiscall google::protobuf::io::Printer::Sub::value(Sub *this)

{
  LogMessage *this_00;
  string_view sVar1;
  string_view str;
  string_view v;
  string_view str_00;
  LogMessage local_20;
  
  if (*(__index_type *)
       ((long)&(this->value_).value.
               super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
               .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_> +
       0x20) == '\0') {
    sVar1._M_str = *(char **)&(this->value_).value.
                              super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                              .
                              super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                              .
                              super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
    ;
    sVar1._M_len = *(size_t *)
                    ((long)&(this->value_).value.
                            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                            .
                            super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    + 8);
    return sVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h"
             ,0x3ea,"str != nullptr");
  str._M_str = "could not find ";
  str._M_len = 0xf;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_20,str);
  v._M_str = (this->key_)._M_dataplus._M_p;
  v._M_len = (this->key_)._M_string_length;
  this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_20,v);
  str_00._M_str = "; found callback instead";
  str_00._M_len = 0x18;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,str_00);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

absl::string_view value() const {
    const auto* str = value_.AsString();
    ABSL_CHECK(str != nullptr)
        << "could not find " << key() << "; found callback instead";
    return *str;
  }